

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O1

void __thiscall
wasm::Memory64Lowering::wrapAddress64
          (Memory64Lowering *this,Expression **ptr,Name memoryOrTableName,bool isTable)

{
  Module *this_00;
  Expression *pEVar1;
  Table *pTVar2;
  Memory *pMVar3;
  Type *pTVar4;
  Unary *this_01;
  
  if (((*ptr)->type).id != 1) {
    this_00 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
              .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>.
              currModule;
    if (isTable) {
      pTVar2 = Module::getTable(this_00,memoryOrTableName);
      pTVar4 = &pTVar2->addressType;
    }
    else {
      pMVar3 = Module::getMemory(this_00,memoryOrTableName);
      pTVar4 = &pMVar3->addressType;
    }
    if (pTVar4->id == 3) {
      pEVar1 = *ptr;
      if ((pEVar1->type).id != 3) {
        __assert_fail("ptr->type == Type::i64",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Memory64Lowering.cpp"
                      ,0x35,"void wasm::Memory64Lowering::wrapAddress64(Expression *&, Name, bool)")
        ;
      }
      this_01 = (Unary *)MixedArena::allocSpace(&this_00->allocator,0x20,8);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
      this_01->op = WrapInt64;
      this_01->value = pEVar1;
      Unary::finalize(this_01);
      *ptr = (Expression *)this_01;
    }
  }
  return;
}

Assistant:

void wrapAddress64(Expression*& ptr,
                     Name memoryOrTableName,
                     bool isTable = false) {
    if (ptr->type == Type::unreachable) {
      return;
    }
    auto& module = *getModule();
    bool is64 = false;
    if (isTable) {
      is64 = module.getTable(memoryOrTableName)->is64();
    } else {
      is64 = module.getMemory(memoryOrTableName)->is64();
    }
    if (is64) {
      assert(ptr->type == Type::i64);
      ptr = Builder(module).makeUnary(UnaryOp::WrapInt64, ptr);
    }
  }